

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

Matrix * __thiscall rw::Matrix::scale(Matrix *this,V3d *scale,CombineOp op)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float32 fVar5;
  float32 fVar6;
  float32 fVar7;
  float32 fVar8;
  float32 fVar9;
  float32 fVar10;
  float32 fVar11;
  Matrix *src2;
  Matrix *src1;
  Matrix *pMVar12;
  Matrix scl;
  Matrix tmp;
  Matrix local_98;
  Matrix local_50;
  
  pMVar12 = &local_98;
  local_98.pos.x = 0.0;
  local_98.pos.y = 0.0;
  local_98.pos.z = 0.0;
  local_98.pad3 = 0;
  local_98.at.x = 0.0;
  local_98.at.y = 0.0;
  local_98.up.z = 0.0;
  local_98.pad1 = 0;
  local_98.right.y = 0.0;
  local_98.right.x = scale->x;
  local_98.up._0_8_ = (ulong)(uint)scale->y << 0x20;
  local_98.pad2 = 0;
  local_98.at.z = scale->z;
  local_98.right.z = 0.0;
  local_98.flags = 3;
  if (op != COMBINEREPLACE) {
    src2 = &local_98;
    src1 = this;
    if ((op != COMBINEPOSTCONCAT) && (src2 = this, src1 = &local_98, op != COMBINEPRECONCAT)) {
      return this;
    }
    pMVar12 = &local_50;
    mult(&local_50,src1,src2);
  }
  fVar10 = (pMVar12->right).x;
  fVar11 = (pMVar12->right).y;
  uVar1 = *(undefined8 *)&(pMVar12->right).z;
  fVar8 = (pMVar12->up).x;
  fVar9 = (pMVar12->up).y;
  uVar2 = *(undefined8 *)&(pMVar12->up).z;
  fVar6 = (pMVar12->at).x;
  fVar7 = (pMVar12->at).y;
  uVar3 = *(undefined8 *)&(pMVar12->at).z;
  fVar5 = (pMVar12->pos).y;
  uVar4 = *(undefined8 *)&(pMVar12->pos).z;
  (this->pos).x = (pMVar12->pos).x;
  (this->pos).y = fVar5;
  *(undefined8 *)&(this->pos).z = uVar4;
  (this->at).x = fVar6;
  (this->at).y = fVar7;
  *(undefined8 *)&(this->at).z = uVar3;
  (this->up).x = fVar8;
  (this->up).y = fVar9;
  *(undefined8 *)&(this->up).z = uVar2;
  (this->right).x = fVar10;
  (this->right).y = fVar11;
  *(undefined8 *)&(this->right).z = uVar1;
  return this;
}

Assistant:

Matrix*
Matrix::scale(const V3d *scale, CombineOp op)
{
	Matrix tmp;
	Matrix scl = identMat;
	scl.right.x = scale->x;
	scl.up.y = scale->y;
	scl.at.z = scale->z;
	scl.flags &= ~IDENTITY;
	switch(op){
	case COMBINEREPLACE:
		*this = scl;
		break;
	case COMBINEPRECONCAT:
		mult(&tmp, &scl, this);
		*this = tmp;
		break;
	case COMBINEPOSTCONCAT:
		mult(&tmp, this, &scl);
		*this = tmp;
		break;
	}
	return this;
}